

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::StreamArchive::decode_payload_deflate
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  uint8_t *puVar4;
  ulong uVar5;
  size_t sVar6;
  mz_ulong mVar7;
  bool bVar8;
  mz_ulong zsize;
  uint8_t *local_50;
  size_t local_38;
  
  if ((entry->header).uncompressed_size != blob_size) {
    return false;
  }
  if (concurrent) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->read_lock);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if (!concurrent) goto LAB_0017a7c5;
    puVar4 = (uint8_t *)operator_new__((ulong)(entry->header).payload_size);
    local_50 = puVar4;
LAB_0017a833:
    bVar8 = false;
    iVar2 = fseek((FILE *)this->file,entry->offset,0);
    if (-1 < iVar2) {
      sVar6 = fread(puVar4,1,(ulong)(entry->header).payload_size,(FILE *)this->file);
      bVar8 = sVar6 == (entry->header).payload_size;
    }
  }
  else {
LAB_0017a7c5:
    puVar4 = this->zlib_buffer;
    uVar5 = (ulong)(entry->header).payload_size;
    if (uVar5 <= this->zlib_buffer_size) {
      local_50 = (uint8_t *)0x0;
      goto LAB_0017a833;
    }
    puVar4 = (uint8_t *)realloc(puVar4,uVar5);
    if (puVar4 == (uint8_t *)0x0) {
      free(this->zlib_buffer);
      this->zlib_buffer = (uint8_t *)0x0;
      uVar5 = 0;
    }
    else {
      this->zlib_buffer = puVar4;
      uVar5 = (ulong)(entry->header).payload_size;
    }
    this->zlib_buffer_size = uVar5;
    puVar4 = this->zlib_buffer;
    local_50 = (uint8_t *)0x0;
    if (puVar4 != (uint8_t *)0x0) goto LAB_0017a833;
    bVar8 = false;
  }
  if (concurrent) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->read_lock);
  }
  if (bVar8) {
    if (((entry->header).crc == 0) ||
       (mVar7 = mz_crc32(0,puVar4,(ulong)(entry->header).payload_size),
       (entry->header).crc == (uint32_t)mVar7)) {
      local_38 = blob_size;
      iVar2 = mz_uncompress((uchar *)blob,&local_38,puVar4,(ulong)(entry->header).payload_size);
      bVar8 = local_38 == blob_size && iVar2 == 0;
      goto LAB_0017a901;
    }
    LVar3 = get_thread_log_level();
    if ((int)LVar3 < 3) {
      bVar8 = false;
      bVar1 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n");
      if (!bVar1) {
        decode_payload_deflate();
        bVar8 = false;
      }
      goto LAB_0017a901;
    }
  }
  bVar8 = false;
LAB_0017a901:
  if (local_50 != (uint8_t *)0x0) {
    operator_delete__(local_50);
  }
  return bVar8;
}

Assistant:

bool decode_payload_deflate(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size)
			return false;

		uint8_t *dst_zlib_buffer = nullptr;
		std::unique_ptr<uint8_t[]> zlib_buffer_holder;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (concurrent)
			{
				dst_zlib_buffer = new uint8_t[entry.header.payload_size];
				zlib_buffer_holder.reset(dst_zlib_buffer);
			}
			else if (zlib_buffer_size < entry.header.payload_size)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, entry.header.payload_size));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = entry.header.payload_size;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}

				if (!zlib_buffer)
					return false;

				dst_zlib_buffer = zlib_buffer;
			}
			else
				dst_zlib_buffer = zlib_buffer;

			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;
			if (fread(dst_zlib_buffer, 1, entry.header.payload_size, file) != entry.header.payload_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, dst_zlib_buffer, entry.header.payload_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		mz_ulong zsize = blob_size;
		if (mz_uncompress(static_cast<unsigned char *>(blob), &zsize, dst_zlib_buffer, entry.header.payload_size) != MZ_OK)
			return false;
		if (zsize != blob_size)
			return false;

		return true;
	}